

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O0

ostream * operator<<(ostream *os,TimeRepresentation<count_time<9,_long>_> *t1)

{
  ostream *poVar1;
  baseType *in_RSI;
  ostream *in_RDI;
  double dVar2;
  
  dVar2 = count_time<9,_long>::toDouble(*in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,dVar2);
  std::operator<<(poVar1,'s');
  return in_RDI;
}

Assistant:

std::ostream&
        operator<<(std::ostream& os, const TimeRepresentation& t1)
    {
        os << Tconv::toDouble(t1.internalTimeCode) << 's';
        return os;
    }